

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O0

void __thiscall helics::apps::Player::Player(Player *this,string_view appName,FederateInfo *fedInfo)

{
  FederateInfo *in_RDI;
  Player *this_00;
  App *in_stack_ffffffffffffffb0;
  string_view in_stack_ffffffffffffffb8;
  
  App::App(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffb8,in_RDI);
  (in_RDI->super_CoreFederateInfo).timeProps.
  super__Vector_base<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__Player_00a47078;
  CLI::std::vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>::vector
            ((vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_> *)
             0x3d8166);
  CLI::std::vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>::
  vector((vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_> *)
         0x3d817c);
  CLI::std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)0x3d8192);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x3d81a8);
  CLI::std::deque<helics::Publication,_std::allocator<helics::Publication>_>::deque
            ((deque<helics::Publication,_std::allocator<helics::Publication>_> *)0x3d81be);
  CLI::std::deque<helics::Endpoint,_std::allocator<helics::Endpoint>_>::deque
            ((deque<helics::Endpoint,_std::allocator<helics::Endpoint>_> *)0x3d81d6);
  this_00 = (Player *)&in_RDI[1].super_CoreFederateInfo.flagProps;
  CLI::std::
  unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  ::unordered_map((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                   *)0x3d81ee);
  CLI::std::
  unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  ::unordered_map((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                   *)0x3d8204);
  *(undefined4 *)&in_RDI[1].defName._M_dataplus._M_p = 0;
  in_RDI[1].defName._M_string_length = 0;
  in_RDI[1].defName.field_2._M_allocated_capacity = 0;
  *(undefined4 *)((long)&in_RDI[1].defName.field_2 + 8) = 5;
  in_RDI[1].coreName._M_dataplus._M_p = (pointer)0x3ff0000000000000;
  in_RDI[1].coreName._M_string_length = 0;
  initialSetup(this_00);
  return;
}

Assistant:

Player::Player(std::string_view appName, const FederateInfo& fedInfo): App(appName, fedInfo)
{
    initialSetup();
}